

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HierarchicalTaskNetworkComponent.cpp
# Opt level: O2

void __thiscall
AI::HierarchicalTaskNetworkComponent::purgeMemoryOfIgnoredActors
          (HierarchicalTaskNetworkComponent *this)

{
  pointer *ppSVar1;
  Actor *pAVar2;
  pointer pSVar3;
  pointer pSVar4;
  pointer pFVar5;
  Actor *pAVar6;
  undefined4 uVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  pointer pEVar11;
  int iVar12;
  pointer piVar13;
  pointer pEVar14;
  Stimulus *stimulus;
  pointer pSVar15;
  pointer pFVar16;
  pointer piVar17;
  vector<AI::FocusLocus,_std::allocator<AI::FocusLocus>_> *__range2;
  int stimulusId;
  vector<int,_std::allocator<int>_> ids;
  int locusId;
  value_type_conflict2 local_8c;
  _Vector_base<int,_std::allocator<int>_> local_88;
  ulong local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  Actor *pAStack_50;
  undefined8 local_48;
  pointer local_40;
  pointer local_38;
  
  local_38 = (this->state).actorsToIgnore.
             super__Vector_base<AI::Actor_*,_std::allocator<AI::Actor_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_40 = (this->state).actorsToIgnore.
             super__Vector_base<AI::Actor_*,_std::allocator<AI::Actor_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  do {
    if (local_38 == local_40) {
      return;
    }
    pAVar2 = *local_38;
    local_8c = 0;
    local_88._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_88._M_impl.super__Vector_impl_data._M_start = (int *)0x0;
    local_88._M_impl.super__Vector_impl_data._M_finish = (int *)0x0;
    pSVar3 = (this->state).memory.sensoryMemory.
             super__Vector_base<AI::Stimulus,_std::allocator<AI::Stimulus>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pSVar15 = (this->state).memory.sensoryMemory.
                   super__Vector_base<AI::Stimulus,_std::allocator<AI::Stimulus>_>._M_impl.
                   super__Vector_impl_data._M_start; pSVar15 != pSVar3; pSVar15 = pSVar15 + 1) {
      if ((pSVar15->type == Visual) && ((pSVar15->field_3).visual.target == pAVar2)) {
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)&local_88,&local_8c);
      }
      local_8c = local_8c + 1;
    }
    std::
    __sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::greater<int>>>
              (local_88._M_impl.super__Vector_impl_data._M_start,
               local_88._M_impl.super__Vector_impl_data._M_finish);
    for (piVar13 = local_88._M_impl.super__Vector_impl_data._M_start;
        piVar13 != local_88._M_impl.super__Vector_impl_data._M_finish; piVar13 = piVar13 + 1) {
      iVar12 = *piVar13;
      pSVar3 = (this->state).memory.sensoryMemory.
               super__Vector_base<AI::Stimulus,_std::allocator<AI::Stimulus>_>._M_impl.
               super__Vector_impl_data._M_start;
      pSVar4 = (this->state).memory.sensoryMemory.
               super__Vector_base<AI::Stimulus,_std::allocator<AI::Stimulus>_>._M_impl.
               super__Vector_impl_data._M_finish;
      local_48 = *(undefined8 *)&pSVar3[iVar12].type;
      pSVar15 = pSVar3 + iVar12;
      local_68._0_4_ = (int)pSVar15->x;
      local_68._4_4_ = pSVar15->y;
      uStack_60 = *(undefined8 *)&pSVar15->intensity;
      local_58 = *(undefined8 *)&pSVar3[iVar12].field_3;
      pAStack_50 = *(Actor **)((long)&pSVar3[iVar12].field_3 + 8);
      uVar7 = *(undefined4 *)&pSVar4[-1].field_0x24;
      pSVar3[iVar12].type = pSVar4[-1].type;
      *(undefined4 *)&pSVar3[iVar12].field_0x24 = uVar7;
      fVar8 = pSVar4[-1].x;
      fVar9 = pSVar4[-1].y;
      fVar10 = pSVar4[-1].intensity;
      uVar7 = *(undefined4 *)&pSVar4[-1].field_0xc;
      pAVar6 = pSVar4[-1].field_3.visual.target;
      *(undefined8 *)&pSVar3[iVar12].field_3 = *(undefined8 *)&pSVar4[-1].field_3;
      *(Actor **)((long)&pSVar3[iVar12].field_3 + 8) = pAVar6;
      pSVar3 = pSVar3 + iVar12;
      pSVar3->x = fVar8;
      pSVar3->y = fVar9;
      pSVar3->intensity = fVar10;
      *(undefined4 *)&pSVar3->field_0xc = uVar7;
      *(undefined8 *)&pSVar4[-1].type = local_48;
      *(undefined8 *)&pSVar4[-1].field_3 = local_58;
      pSVar4[-1].field_3.visual.target = pAStack_50;
      pSVar4[-1].x = (float)(int)local_68;
      pSVar4[-1].y = (float)local_68._4_4_;
      *(undefined8 *)&pSVar4[-1].intensity = uStack_60;
      ppSVar1 = &(this->state).memory.sensoryMemory.
                 super__Vector_base<AI::Stimulus,_std::allocator<AI::Stimulus>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppSVar1 = *ppSVar1 + -1;
    }
    local_68 = local_68 & 0xffffffff00000000;
    if (local_88._M_impl.super__Vector_impl_data._M_finish !=
        local_88._M_impl.super__Vector_impl_data._M_start) {
      local_88._M_impl.super__Vector_impl_data._M_finish =
           local_88._M_impl.super__Vector_impl_data._M_start;
    }
    pFVar5 = (this->state).memory.focusLocus.
             super__Vector_base<AI::FocusLocus,_std::allocator<AI::FocusLocus>_>._M_impl.
             super__Vector_impl_data._M_finish;
    iVar12 = 0;
    for (pFVar16 = (this->state).memory.focusLocus.
                   super__Vector_base<AI::FocusLocus,_std::allocator<AI::FocusLocus>_>._M_impl.
                   super__Vector_impl_data._M_start; pFVar16 != pFVar5; pFVar16 = pFVar16 + 1) {
      pEVar11 = (pFVar16->engrams).super__Vector_base<AI::Engram,_std::allocator<AI::Engram>_>.
                _M_impl.super__Vector_impl_data._M_start;
      do {
        pEVar14 = pEVar11;
        if (pEVar14 ==
            (pFVar16->engrams).super__Vector_base<AI::Engram,_std::allocator<AI::Engram>_>._M_impl.
            super__Vector_impl_data._M_finish) goto LAB_00138a71;
        pEVar11 = pEVar14 + 1;
      } while ((pEVar14->type != Saw) || ((pEVar14->stimulus).field_3.visual.target != pAVar2));
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)&local_88,(value_type_conflict2 *)&local_68);
      iVar12 = (int)local_68;
LAB_00138a71:
      iVar12 = iVar12 + 1;
      local_68 = CONCAT44(local_68._4_4_,iVar12);
    }
    std::
    __sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::greater<int>>>
              (local_88._M_impl.super__Vector_impl_data._M_start,
               local_88._M_impl.super__Vector_impl_data._M_finish);
    piVar13 = local_88._M_impl.super__Vector_impl_data._M_finish;
    for (piVar17 = local_88._M_impl.super__Vector_impl_data._M_start; piVar17 != piVar13;
        piVar17 = piVar17 + 1) {
      std::swap<AI::FocusLocus>
                ((this->state).memory.focusLocus.
                 super__Vector_base<AI::FocusLocus,_std::allocator<AI::FocusLocus>_>._M_impl.
                 super__Vector_impl_data._M_start + *piVar17,
                 (this->state).memory.focusLocus.
                 super__Vector_base<AI::FocusLocus,_std::allocator<AI::FocusLocus>_>._M_impl.
                 super__Vector_impl_data._M_finish + -1);
      std::vector<AI::FocusLocus,_std::allocator<AI::FocusLocus>_>::pop_back
                (&(this->state).memory.focusLocus);
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_88);
    local_38 = local_38 + 1;
  } while( true );
}

Assistant:

void HierarchicalTaskNetworkComponent::purgeMemoryOfIgnoredActors()
{
	for (auto ignoredActor : state.actorsToIgnore)
	{
		int stimulusId = 0;
		std::vector<int> ids;
		for (auto& stimulus : state.memory.sensoryMemory)
		{
			if (stimulus.type == StimulusType::Visual)
			{
				if (stimulus.visual.target == ignoredActor)
				{
					ids.push_back(stimulusId);
				}
			}

			stimulusId++;
		}

		std::sort(begin(ids), end(ids), std::greater<int>());

		for(auto id : ids)
		{
			std::swap(state.memory.sensoryMemory[id], state.memory.sensoryMemory.back());
			state.memory.sensoryMemory.pop_back();
		}

		int locusId = 0;
		ids.clear();
		for(auto& locus : state.memory.focusLocus)
		{
			for (auto& engram : locus.engrams)
			{
				if (engram.type == EngramType::Saw)
				{
					if (engram.stimulus.visual.target == ignoredActor)
					{
						ids.push_back(locusId);
						break;
					}
				}
			}

			locusId++;
		}

		std::sort(begin(ids), end(ids), std::greater<int>());

		for(auto id : ids)
		{
			std::swap(state.memory.focusLocus[id], state.memory.focusLocus.back());
			state.memory.focusLocus.pop_back();
		}
	}	
}